

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<re2::Frag>::Walker(Walker<re2::Frag> *this)

{
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  *this_00;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Walker_00906da0;
  this_00 = (stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
             *)operator_new(0x50);
  std::
  stack<re2::WalkState<re2::Frag>,std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>>
  ::stack<std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>,void>
            (this_00);
  in_RDI[1] = this_00;
  *(undefined1 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new std::stack<WalkState<T> >;
  stopped_early_ = false;
}